

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeSCP.cpp
# Opt level: O0

int __thiscall
FormatTypeSCP::LoadDisk
          (FormatTypeSCP *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  byte bVar1;
  byte bVar2;
  int sizeOfBuffer;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uchar uVar6;
  int iVar7;
  uint uVar8;
  IDisk *this_00;
  ulong uVar9;
  MFMTrack *pMVar10;
  uchar *puVar11;
  ulong uVar12;
  ulong *puVar13;
  uchar *puVar14;
  undefined8 *puVar15;
  Revolution *pRVar16;
  ulong uVar17;
  bool bVar18;
  anon_struct_48_3_f145af35 *local_118;
  anon_struct_48_3_f145af35 *local_f8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_c0;
  int local_bc;
  int track_1;
  int side_2;
  uchar *cellbuffer;
  int offset;
  int length;
  int duration;
  int revolution;
  int dbg_1;
  uint track;
  int side_1;
  uchar *track_buffer;
  int local_80;
  int i;
  int tr;
  int side;
  int nbtracks;
  int dbg;
  uint crc;
  uint checkSum;
  uchar nb_heads;
  uchar width;
  IDisk *new_disk;
  uchar *header;
  uint check_sum_computed;
  uchar flags;
  uchar endTrack;
  uchar startTrack;
  uchar numRevolution;
  uchar diskType;
  uchar version;
  ILoadingProgress *loading_progress_local;
  IDisk **created_disk_local;
  size_t size_local;
  uchar *buffer_local;
  FormatTypeSCP *this_local;
  
  iVar7 = memcmp(buffer,"SCP",3);
  if (iVar7 == 0) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar1 = buffer[5];
    bVar2 = buffer[7];
    for (nbtracks = 0x10; (uint)nbtracks < size; nbtracks = nbtracks + 1) {
    }
    uVar6 = '\x01';
    if (0x2a < bVar2) {
      uVar6 = '\x02';
    }
    this_00->nb_sides_ = uVar6;
    if (this_00->nb_sides_ == '\x01') {
      local_d4 = (uint)bVar2;
    }
    else {
      local_d4 = bVar2 / 2;
    }
    local_d4 = local_d4 + 1;
    for (i = 0; i < (int)(uint)this_00->nb_sides_; i = i + 1) {
      this_00->side_[i].nb_tracks = local_d4;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)(int)local_d4;
      uVar9 = SUB168(auVar4 * ZEXT816(0x20),0);
      if (SUB168(auVar4 * ZEXT816(0x20),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      pMVar10 = (MFMTrack *)operator_new__(uVar9);
      this_00->side_[i].tracks = pMVar10;
      memset(this_00->side_[i].tracks,0,(long)(int)local_d4 << 5);
      for (local_80 = 0; local_80 < (int)local_d4; local_80 = local_80 + 1) {
        this_00->side_[i].tracks[local_80].nb_revolutions = 1;
      }
    }
    for (track_buffer._4_4_ = 0; track_buffer._4_4_ < 0xa6;
        track_buffer._4_4_ = track_buffer._4_4_ + 1) {
      this->tracks_header_[track_buffer._4_4_].offset =
           *(uint *)(buffer + (track_buffer._4_4_ * 4 + 0x10));
      if (this->tracks_header_[track_buffer._4_4_].offset != 0) {
        puVar11 = buffer + this->tracks_header_[track_buffer._4_4_].offset;
        iVar7 = memcmp(puVar11,"TRK",3);
        if (iVar7 != 0) {
          return -3;
        }
        if (this_00->nb_sides_ == '\x01') {
          local_d8 = 0;
        }
        else {
          local_d8 = puVar11[3] & 1;
        }
        if (this_00->nb_sides_ == '\x01') {
          local_dc = (uint)puVar11[3];
        }
        else {
          local_dc = (int)(uint)puVar11[3] >> 1;
        }
        if (this_00->side_[(int)local_d8].nb_tracks <= local_dc) {
          return -1;
        }
        this_00->side_[(int)local_d8].tracks[local_dc].nb_revolutions = (uint)bVar1;
        uVar9 = CONCAT71(0,bVar1);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar9;
        uVar12 = SUB168(auVar5 * ZEXT816(0x30),0);
        uVar17 = uVar12 + 8;
        if (SUB168(auVar5 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar12) {
          uVar17 = 0xffffffffffffffff;
        }
        puVar13 = (ulong *)operator_new__(uVar17);
        *puVar13 = uVar9;
        pRVar16 = (Revolution *)(puVar13 + 1);
        if (uVar9 != 0) {
          local_f8 = (anon_struct_48_3_f145af35 *)pRVar16;
          do {
            IDisk::anon_struct_48_3_f145af35::Revolution(local_f8);
            local_f8 = local_f8 + 1;
          } while (local_f8 != (anon_struct_48_3_f145af35 *)(pRVar16 + uVar9));
        }
        this_00->side_[(int)local_d8].tracks[local_dc].revolution = pRVar16;
        for (length = 0; length < (int)(uint)bVar1; length = length + 1) {
          iVar7 = *(int *)(puVar11 + (length * 0xc + 4));
          sizeOfBuffer = *(int *)(puVar11 + (length * 0xc + 8));
          iVar3 = *(int *)(puVar11 + (length * 0xc + 0xc));
          this->rpm_correction_ = (double)((iVar7 * 0x19) / 1000000) / 200.0;
          uVar8 = ComputeTrack(this,(uchar *)0x0,puVar11 + iVar3,sizeOfBuffer,iVar7);
          this_00->side_[(int)local_d8].tracks[local_dc].revolution[length].size = uVar8;
          puVar14 = (uchar *)operator_new__((ulong)this_00->side_[(int)local_d8].tracks[local_dc].
                                                   revolution[length].size);
          this_00->side_[(int)local_d8].tracks[local_dc].revolution[length].bitfield = puVar14;
          uVar8 = ComputeTrack(this,this_00->side_[(int)local_d8].tracks[local_dc].revolution
                                    [length].bitfield,puVar11 + iVar3,sizeOfBuffer,iVar7);
          this_00->side_[(int)local_d8].tracks[local_dc].revolution[length].size = uVar8;
        }
      }
    }
    for (local_bc = 0; local_bc < (int)(uint)this_00->nb_sides_; local_bc = local_bc + 1) {
      local_c0 = 0;
      while( true ) {
        bVar18 = false;
        if ((int)local_c0 < 0x2b) {
          bVar18 = local_c0 < this_00->side_[local_bc].nb_tracks;
        }
        if (!bVar18) break;
        if (this_00->side_[local_bc].tracks[(int)local_c0].revolution == (Revolution *)0x0) {
          this_00->side_[local_bc].tracks[(int)local_c0].nb_revolutions = 1;
          puVar15 = (undefined8 *)operator_new__(0x38);
          *puVar15 = 1;
          local_118 = (anon_struct_48_3_f145af35 *)(puVar15 + 1);
          do {
            IDisk::anon_struct_48_3_f145af35::Revolution(local_118);
            local_118 = local_118 + 1;
          } while (local_118 != (anon_struct_48_3_f145af35 *)(puVar15 + 7));
          this_00->side_[local_bc].tracks[(int)local_c0].revolution = (Revolution *)(puVar15 + 1);
          puVar11 = (uchar *)operator_new__(100000);
          (this_00->side_[local_bc].tracks[(int)local_c0].revolution)->bitfield = puVar11;
          (this_00->side_[local_bc].tracks[(int)local_c0].revolution)->size = 100000;
          memset((this_00->side_[local_bc].tracks[(int)local_c0].revolution)->bitfield,0,100000);
        }
        local_c0 = local_c0 + 1;
      }
    }
    *created_disk = this_00;
    (*(*created_disk)->_vptr_IDisk[0x14])();
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int FormatTypeSCP::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                            ILoadingProgress* loading_progress)
{
   unsigned char version, diskType, numRevolution;
   unsigned char startTrack, endTrack, flags;
   unsigned int check_sum_computed = 0;
   const unsigned char* header = buffer;

   if (memcmp(header, "SCP", 3) == 0)
   {
      IDisk* new_disk = new IDisk();

      version = header[3];
      diskType = header[4];
      numRevolution = header[5];
      startTrack = header[6];
      endTrack = header[7];
      flags = header[8];
      unsigned char width = header[9];
      unsigned char nb_heads = header[0x0A];
      unsigned int checkSum = *((unsigned int*)(&header[0x0C]));

      // Check the checksum !
      for (unsigned int crc = 0x10; crc < size; crc++)
      {
         check_sum_computed += header[crc];
      }
      // Compare :
      if (check_sum_computed != checkSum)
      {
         // Something to do ?
         int dbg = 1;
      }


      // Number of side :
      new_disk->nb_sides_ = (endTrack > 42) ? 2 : 1;
      int nbtracks = ((new_disk->nb_sides_ == 1) ? (endTrack) : (endTrack) / 2) + 1;
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         new_disk->side_[side].nb_tracks = nbtracks;
         new_disk->side_[side].tracks = new IDisk::MFMTrack[nbtracks];
         memset(new_disk->side_[side].tracks, 0, sizeof(IDisk::MFMTrack) * nbtracks);
         for (int tr = 0; tr < nbtracks; tr++)
         {
            new_disk->side_[side].tracks[tr].nb_revolutions = 1;
         }
      }

      // Track data header
      for (int i = 0; i < 166; i++)
      {
         tracks_header_[i].offset = *((unsigned int*)(&header[0x10 + i * 4]));

         if (tracks_header_[i].offset != 0)
         {
            const unsigned char* track_buffer = &header[tracks_header_[i].offset];
            // Check the TRK
            if (memcmp(&track_buffer[0], "TRK", 3) != 0)
            {
               // Error : No valid SCP file
               return -3;
            }

            // Track number
            int side = (new_disk->nb_sides_ == 1) ? 0 : (track_buffer[0x03] & 0x1);
            unsigned int track = (new_disk->nb_sides_ == 1) ? track_buffer[0x03] : (track_buffer[0x03] >> 1);

            if (track >= new_disk->side_[side].nb_tracks)
            {
               // TODO : Do Something here !
               int dbg = 1;
               return -1;
            }

            // Revolutions
            new_disk->side_[side].tracks[track].nb_revolutions = numRevolution;
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[numRevolution];

            for (int revolution = 0; revolution < numRevolution; revolution++)
            {
               //
               int duration = *((unsigned int*)(&track_buffer[0x04 + revolution * 12]));
               int length = *((unsigned int*)(&track_buffer[0x08 + revolution * 12]));
               int offset = *((unsigned int*)(&track_buffer[0x0C + revolution * 12]));

               //timeElapsed / ick * 1000;
               rpm_correction_ = (duration * 25 / 1000000) / 200.0;

               // Read the whole bitcells
               const unsigned char* cellbuffer = &track_buffer[offset];

               // Comute size in term of bits
               new_disk->side_[side].tracks[track].revolution[revolution].size = ComputeTrack(
                  NULL, cellbuffer, length, duration);

               // Fill the bitfield
               new_disk->side_[side].tracks[track].revolution[revolution].bitfield = new unsigned char[new_disk->side_[
                  side].tracks[track].revolution[revolution].size];
               new_disk->side_[side].tracks[track].revolution[revolution].size = ComputeTrack(
                  new_disk->side_[side].tracks[track].revolution[revolution].bitfield, cellbuffer, length, duration);
            }

            //AdjustLength ( m_Disk[side].Tracks[track].Revolution, numRevolution);

            if (track == 0)
            {
               //DumpTrack (0, 0, 0);
            }
         }
      }
      // Adjust missing tracks :
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         for (int track = 0; track < 43 && track < new_disk->side_[side].nb_tracks; track++)
         {
            if (new_disk->side_[side].tracks[track].revolution == NULL)
            {
               // Fill this revolution with random datas
               new_disk->side_[side].tracks[track].nb_revolutions = 1;
               new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[6250 * 16];
               new_disk->side_[side].tracks[track].revolution[0].size = 6250 * 16;
               memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0, 6250 * 16);
            }
         }
      }
      created_disk = new_disk;
   }
   else
   {
      // Erreur : Not a DSK file !
      return FILE_ERROR;
   }

   created_disk->CreateTrackFromMultiRevolutions();

   return OK;
}